

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorProto::_internal_has_source_code_info(FileDescriptorProto *this)

{
  long in_RDI;
  bool value;
  
  return (*(uint *)(in_RDI + 0x10) & 0x10) != 0;
}

Assistant:

inline bool FileDescriptorProto::_internal_has_source_code_info() const {
  bool value = (_has_bits_[0] & 0x00000010u) != 0;
  PROTOBUF_ASSUME(!value || source_code_info_ != nullptr);
  return value;
}